

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GPUShaderFP64Test5::executeIteration(GPUShaderFP64Test5 *this,_test_case *test_case)

{
  float fVar1;
  GLint GVar2;
  code *pcVar3;
  bool bVar4;
  _variable_type _Var5;
  uint uVar6;
  int iVar7;
  deUint32 dVar8;
  GLenum GVar9;
  double *pdVar10;
  undefined4 extraout_var;
  uchar *data_ptr;
  TestError *this_00;
  long lVar11;
  _variable_type type;
  char *msg;
  
  _Var5 = Utils::getBaseVariableType(test_case->src_type);
  type = VARIABLE_TYPE_INT;
  if (_Var5 != VARIABLE_TYPE_BOOL) {
    type = _Var5;
  }
  uVar6 = Utils::getBaseVariableTypeComponentSize(type);
  pdVar10 = (double *)operator_new__((ulong)(uVar6 * 5));
  this->m_base_value_bo_data = (uchar *)pdVar10;
  if ((type < VARIABLE_TYPE_UVEC2) && ((0x80060010U >> (type & VARIABLE_TYPE_UINT) & 1) != 0)) {
    lVar11 = 0x28;
    do {
      fVar1 = *(float *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode
                        + lVar11 * 4);
      if (type == VARIABLE_TYPE_INT) {
        *(int *)pdVar10 = (int)fVar1;
      }
      else if (type == VARIABLE_TYPE_FLOAT) {
        *(float *)pdVar10 = fVar1;
      }
      else if (type == VARIABLE_TYPE_DOUBLE) {
        *pdVar10 = (double)fVar1;
      }
      else {
        *(float *)pdVar10 = (float)(long)fVar1;
      }
      pdVar10 = (double *)((long)pdVar10 + (ulong)uVar6);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x2d);
    iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar11 = CONCAT44(extraout_var,iVar7);
    (**(code **)(lVar11 + 0x40))(0x8892,this->m_base_value_bo_id);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar8,"glBindBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1cc3);
    (**(code **)(lVar11 + 0x168))(0x8892,0,(ulong)(uVar6 * 5),this->m_base_value_bo_data);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar8,"glBufferSubData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1cc6);
    if (type == VARIABLE_TYPE_FLOAT) {
      (**(code **)(lVar11 + 0x19f0))(this->m_po_base_value_attribute_location,1,0x1406,0,0,0);
      dVar8 = (**(code **)(lVar11 + 0x800))();
      msg = "glVertexAttribPointer() call failed.";
      iVar7 = 0x1cd1;
    }
    else if ((type == VARIABLE_TYPE_INT) || (type == VARIABLE_TYPE_UINT)) {
      pcVar3 = *(code **)(lVar11 + 0x1958);
      GVar2 = this->m_po_base_value_attribute_location;
      GVar9 = Utils::getGLDataTypeOfBaseVariableType(type);
      (*pcVar3)(GVar2,1,GVar9,0,0);
      dVar8 = (**(code **)(lVar11 + 0x800))();
      msg = "glVertexAttribIPointer() call failed.";
      iVar7 = 0x1cd8;
    }
    else {
      (**(code **)(lVar11 + 0x19a8))(this->m_po_base_value_attribute_location,1,0x140a,0,0);
      dVar8 = (**(code **)(lVar11 + 0x800))();
      msg = "glVertxAttribLPointer() call failed.";
      iVar7 = 0x1ce1;
    }
    glu::checkError(dVar8,msg,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,iVar7);
    (**(code **)(lVar11 + 0x610))(this->m_po_base_value_attribute_location);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar8,"glEnableVertexAttribArray() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1ce5);
    (**(code **)(lVar11 + 0x1680))(this->m_po_id);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar8,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1ce9);
    (**(code **)(lVar11 + 0x30))(0);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar8,"glBeginTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1cec);
    (**(code **)(lVar11 + 0x538))(0,0,5);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar8,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1cef);
    (**(code **)(lVar11 + 0x638))();
    dVar8 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar8,"glEndTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1cf2);
    data_ptr = (uchar *)(**(code **)(lVar11 + 0xcf8))(0x8c8e,35000);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar8,"glMapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1cf7);
    bVar4 = verifyXFBData(this,data_ptr,test_case);
    (**(code **)(lVar11 + 0x1670))(0x8c8e);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar8,"glUnmapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1cff);
    if (this->m_base_value_bo_data != (uchar *)0x0) {
      operator_delete__(this->m_base_value_bo_data);
      this->m_base_value_bo_data = (uchar *)0x0;
    }
    return bVar4;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized base value type",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
             ,0x1cb8);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool GPUShaderFP64Test5::executeIteration(const _test_case& test_case)
{
	bool result = true;

	/* Convert the base values array to the type of input attribute we'll be using
	 * for the iteration.
	 */
	Utils::_variable_type base_value_type = Utils::getBaseVariableType(test_case.src_type);

	if (base_value_type == Utils::VARIABLE_TYPE_BOOL)
	{
		/* bools are actually represented by ints, since bool varyings are not allowed */
		base_value_type = Utils::VARIABLE_TYPE_INT;
	}

	const unsigned int base_value_component_size = Utils::getBaseVariableTypeComponentSize(base_value_type);
	const unsigned int n_base_values			 = sizeof(m_base_values) / sizeof(m_base_values[0]);

	m_base_value_bo_data = new unsigned char[base_value_component_size * n_base_values];

	unsigned char* base_value_traveller_ptr = m_base_value_bo_data;

	for (unsigned int n_base_value = 0; n_base_value < n_base_values; ++n_base_value)
	{
		switch (base_value_type)
		{
		case Utils::VARIABLE_TYPE_DOUBLE:
			*((double*)base_value_traveller_ptr) = (double)m_base_values[n_base_value];
			break;
		case Utils::VARIABLE_TYPE_FLOAT:
			*((float*)base_value_traveller_ptr) = (float)m_base_values[n_base_value];
			break;
		case Utils::VARIABLE_TYPE_INT:
			*((int*)base_value_traveller_ptr) = (int)m_base_values[n_base_value];
			break;
		case Utils::VARIABLE_TYPE_UINT:
			*((unsigned int*)base_value_traveller_ptr) = (unsigned int)m_base_values[n_base_value];
			break;

		default:
		{
			TCU_FAIL("Unrecognized base value type");
		}
		}

		base_value_traveller_ptr += base_value_component_size;
	} /* for (all base values) */

	/* Update buffer object storage with the data we've just finished preparing. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindBuffer(GL_ARRAY_BUFFER, m_base_value_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferSubData(GL_ARRAY_BUFFER, 0 /* offset */, base_value_component_size * n_base_values, m_base_value_bo_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

	/* Configure vertex attribute array corresponding to 'base_value' attribute, so that the
	 * new data is interpreted correctly.
	 */
	if (base_value_type == Utils::VARIABLE_TYPE_FLOAT)
	{
		gl.vertexAttribPointer(m_po_base_value_attribute_location, 1,							  /* size */
							   Utils::getGLDataTypeOfBaseVariableType(base_value_type), GL_FALSE, /* normalized */
							   0,																  /* stride */
							   DE_NULL);														  /* pointer */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer() call failed.");
	}
	else if (base_value_type == Utils::VARIABLE_TYPE_INT || base_value_type == Utils::VARIABLE_TYPE_UINT)
	{
		gl.vertexAttribIPointer(m_po_base_value_attribute_location, 1,						/* size */
								Utils::getGLDataTypeOfBaseVariableType(base_value_type), 0, /* stride */
								DE_NULL);													/* pointer */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribIPointer() call failed.");
	}
	else
	{
		DE_ASSERT(base_value_type == Utils::VARIABLE_TYPE_DOUBLE);

		gl.vertexAttribLPointer(m_po_base_value_attribute_location, 1, /* size */
								GL_DOUBLE, 0,						   /* stride */
								DE_NULL);							   /* pointer */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glVertxAttribLPointer() call failed.");
	}

	gl.enableVertexAttribArray(m_po_base_value_attribute_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray() call failed.");

	/* Execute the draw call */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
	{
		gl.drawArrays(GL_POINTS, 0 /* first */, n_base_values);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

	/* Map the XFB buffer object into process space */
	void* xfb_data_ptr = gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");
	DE_ASSERT(xfb_data_ptr != NULL);

	/* Verify the data */
	result &= verifyXFBData((const unsigned char*)xfb_data_ptr, test_case);

	/* Unmap the XFB BO */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

	/** Good to release the data buffer at this point */
	if (m_base_value_bo_data != DE_NULL)
	{
		delete[] m_base_value_bo_data;

		m_base_value_bo_data = DE_NULL;
	}

	/* All done */
	return result;
}